

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall phosg::Image::invert(Image *this)

{
  uint64_t local_50;
  uint64_t a;
  uint64_t b;
  uint64_t g;
  uint64_t r;
  ssize_t x;
  ssize_t y;
  ssize_t h;
  ssize_t w;
  Image *this_local;
  
  w = (ssize_t)this;
  h = get_width(this);
  y = get_height(this);
  for (x = 0; x < y; x = x + 1) {
    for (r = 0; (long)r < h; r = r + 1) {
      read_pixel(this,r,x,&g,&b,&a,&local_50);
      write_pixel(this,r,x,this->max_value - g,this->max_value - b,this->max_value - a,
                  this->max_value - local_50);
    }
  }
  return;
}

Assistant:

void Image::invert() {
  ssize_t w = this->get_width();
  ssize_t h = this->get_height();
  for (ssize_t y = 0; y < h; y++) {
    for (ssize_t x = 0; x < w; x++) {
      uint64_t r, g, b, a;
      this->read_pixel(x, y, &r, &g, &b, &a);
      this->write_pixel(x, y, this->max_value - r, this->max_value - g, this->max_value - b, this->max_value - a);
    }
  }
}